

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucky.c
# Opt level: O2

word ** makeArray(Abc_TtStore_t *p)

{
  uint uVar1;
  word **ppwVar2;
  word *__dest;
  ulong uVar3;
  ulong uVar4;
  size_t __size;
  
  uVar1 = p->nFuncs;
  ppwVar2 = (word **)malloc((long)(int)uVar1 << 3);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    __size = (long)p->nWords << 3;
    __dest = (word *)malloc(__size);
    ppwVar2[uVar3] = __dest;
    memcpy(__dest,p->pFuncs[uVar3],__size);
  }
  return ppwVar2;
}

Assistant:

word** makeArray(Abc_TtStore_t* p)
{
    int i;
    word** a;
    a = (word**)malloc(sizeof(word*)*(p->nFuncs));
    for(i=0;i<p->nFuncs;i++)
    {
        a[i] = (word*)malloc(sizeof(word)*(p->nWords));
        memcpy(a[i],p->pFuncs[i],sizeof(word)*(p->nWords));

    }
    return a;
}